

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void doActivate<false>(QObject *sender,int signal_index,void **argv)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  QObjectPrivate *pQVar6;
  Type this;
  Connection *pCVar7;
  Connection *pCVar8;
  Type pQVar9;
  Connection *pCVar10;
  char *pcVar11;
  char *pcVar12;
  Type pQVar13;
  undefined4 extraout_var;
  ConnectionData *in_RDX;
  int in_ESI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  bool bVar14;
  int method;
  int methodIndex;
  StaticMetaCallFunction callFunction;
  int method_relative;
  QMetaCallEvent *ev;
  bool receiverInSameThread;
  QThreadData *td;
  QObject *receiver;
  Connection *c;
  uint highestConnectionId;
  bool inSenderThread;
  HANDLE currentThreadId;
  ConnectionList *list;
  SignalVector *signalVector;
  bool senderDeleted;
  QSignalSpyCallbackSet *signal_spy_set;
  QObjectPrivate *sp;
  SlotObjectGuard obj;
  QSemaphore semaphore;
  ConnectionDataPointer connections;
  Sender senderData;
  QMutexLocker<QBasicMutex> locker;
  QMutexLocker<QBasicMutex> lock;
  void *empty_argv [1];
  ConnectionData *in_stack_fffffffffffffde8;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 *in_stack_fffffffffffffdf0;
  LockPolicy lockPolicy;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  QObjectPrivate *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  void **in_stack_fffffffffffffe20;
  Type in_stack_fffffffffffffe28;
  Connection *in_stack_fffffffffffffe30;
  QEvent *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Connection *in_stack_fffffffffffffe48;
  Connection *in_stack_fffffffffffffea8;
  Connection *c_00;
  int signal;
  int in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int local_108;
  Type local_e0;
  QObjectPrivate *local_c8;
  ConnectionData *local_a0;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 local_80;
  anon_union_8_4_8763c6f1_for_QSemaphore_0 local_78 [4];
  undefined1 *local_58;
  undefined1 local_50 [32];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  AtomicType local_8;
  
  local_8._M_b._M_p = ((AtomicType *)(in_FS_OFFSET + 0x28))->_M_b;
  pQVar6 = QObjectPrivate::get((QObject *)0x400b30);
  if ((*(uint *)&(pQVar6->super_QObjectData).field_0x30 >> 1 & 1) == 0) {
    bVar2 = QObjectPrivate::isDeclarativeSignalConnected
                      ((QObjectPrivate *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc);
    if ((bVar2) &&
       (QAbstractDeclarativeData::signalEmitted !=
        (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr_int_void_ptr_ptr *)0x0)) {
      (*QAbstractDeclarativeData::signalEmitted)
                ((pQVar6->field_3).declarativeData,(QObject *)in_RDI,in_ESI,(void **)in_RDX);
    }
    memset(&stack0xfffffffffffffff0,0,8);
    local_a0 = in_RDX;
    if (in_RDX == (ConnectionData *)0x0) {
      local_a0 = (ConnectionData *)&stack0xfffffffffffffff0;
    }
    bVar2 = QObjectPrivate::maybeSignalConnected
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    if (bVar2) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x400c28);
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::QExplicitlySharedDataPointer
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
                 &in_stack_fffffffffffffdf0->u,in_stack_fffffffffffffde8);
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x400c45);
      this = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                       ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x400c51);
      signal = in_ESI;
      iVar4 = QObjectPrivate::SignalVector::count(this);
      if (signal < iVar4) {
        local_c8 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,in_ESI);
      }
      else {
        local_c8 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
      }
      pCVar7 = (Connection *)QThread::currentThreadId();
      c_00 = pCVar7;
      QObjectPrivate::get((QObject *)0x400cf5);
      QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x400d01);
      pCVar8 = (Connection *)
               QBasicAtomicPointer<void>::loadRelaxed((QBasicAtomicPointer<void> *)0x400d0d);
      bVar2 = c_00 == pCVar8;
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
                ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x400d34);
      uVar5 = QBasicAtomicInteger<unsigned_int>::loadRelaxed
                        ((QBasicAtomicInteger<unsigned_int> *)0x400d3c);
      do {
        local_e0 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                             ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x400d50);
        if (local_e0 != (Type)0x0) {
          do {
            pCVar8 = (Connection *)
                     QBasicAtomicPointer<QObject>::loadRelaxed
                               ((QBasicAtomicPointer<QObject> *)0x400d7b);
            if ((pCVar8 != (Connection *)0x0) &&
               (pQVar9 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                                   ((QBasicAtomicPointer<QThreadData> *)0x400da4),
               pQVar9 != (Type)0x0)) {
              if (bVar2) {
                in_stack_fffffffffffffea8 = pCVar7;
                pCVar10 = (Connection *)
                          QBasicAtomicPointer<void>::loadRelaxed
                                    ((QBasicAtomicPointer<void> *)0x400def);
                bVar14 = in_stack_fffffffffffffea8 == pCVar10;
              }
              else {
                local_20 = &DAT_aaaaaaaaaaaaaaaa;
                local_18 = &DAT_aaaaaaaaaaaaaaaa;
                signalSlotLock((QObject *)pCVar8);
                QMutexLocker<QBasicMutex>::QMutexLocker
                          ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u,
                           (QBasicMutex *)in_stack_fffffffffffffde8);
                pCVar10 = (Connection *)
                          QBasicAtomicPointer<void>::loadRelaxed
                                    ((QBasicAtomicPointer<void> *)0x400e6a);
                bVar14 = pCVar7 == pCVar10;
                QMutexLocker<QBasicMutex>::~QMutexLocker
                          ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u);
              }
              if ((((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 0) && (!bVar14)) ||
                 ((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 2)) {
                queued_activate((QObject *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),signal
                                ,c_00,(void **)in_stack_fffffffffffffea8);
              }
              else if ((*(uint *)&local_e0->field_0x54 >> 0x1b & 3) == 3) {
                if (bVar14) {
                  QMessageLogger::QMessageLogger
                            ((QMessageLogger *)
                             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                             (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (char *)in_stack_fffffffffffffde8);
                  (**in_RDI->_vptr_QEvent)();
                  pcVar11 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffde8);
                  (*(code *)(((pCVar8->super_ConnectionOrSignalVector).field_0.next)->
                            super_ConnectionOrSignalVector).field_0)();
                  pcVar12 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffde8);
                  QMessageLogger::warning
                            ((QMessageLogger *)&local_78[0].u,
                             "Qt: Dead lock detected while activating a BlockingQueuedConnection: Sender is %s(%p), receiver is %s(%p)"
                             ,pcVar11,in_RDI,pcVar12,pCVar8);
                }
                if ((-1 < *(int *)&local_e0->field_0x54) ||
                   (bVar14 = QObjectPrivate::removeConnection(in_stack_fffffffffffffe48), bVar14)) {
                  local_80.d = (QSemaphorePrivate *)&DAT_aaaaaaaaaaaaaaaa;
                  QSemaphore::QSemaphore
                            ((QSemaphore *)&in_stack_fffffffffffffdf0->u,
                             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
                  local_30 = &DAT_aaaaaaaaaaaaaaaa;
                  local_28 = &DAT_aaaaaaaaaaaaaaaa;
                  signalSlotLock((QObject *)pCVar8);
                  QMutexLocker<QBasicMutex>::QMutexLocker
                            ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u,
                             (QBasicMutex *)in_stack_fffffffffffffde8);
                  if ((*(int *)&local_e0->field_0x54 < 0) ||
                     (pQVar13 = QBasicAtomicPointer<QObject>::loadAcquire
                                          ((QBasicAtomicPointer<QObject> *)0x4010c1),
                     pQVar13 != (Type)0x0)) {
                    if ((*(uint *)&local_e0->field_0x54 >> 0x1d & 1) == 0) {
                      operator_new(0x78);
                      in_stack_fffffffffffffdf0 = &local_80;
                      in_stack_fffffffffffffde8 = local_a0;
                      QMetaCallEvent::QMetaCallEvent
                                ((QMetaCallEvent *)
                                 CONCAT17(in_stack_fffffffffffffe17,
                                          CONCAT16(in_stack_fffffffffffffe16,
                                                   in_stack_fffffffffffffe10)),
                                 (ushort)((ulong)in_stack_fffffffffffffe08 >> 0x30),
                                 (ushort)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                                 (StaticMetaCallFunction)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                 (QObject *)
                                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                 in_stack_fffffffffffffe20,(QSemaphore *)in_stack_fffffffffffffe28);
                    }
                    else {
                      operator_new(0x78);
                      QMetaCallEvent::QMetaCallEvent
                                ((QMetaCallEvent *)
                                 CONCAT17(in_stack_fffffffffffffe17,
                                          CONCAT16(in_stack_fffffffffffffe16,
                                                   in_stack_fffffffffffffe10)),
                                 (QSlotObjectBase *)in_stack_fffffffffffffe08,
                                 (QObject *)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                 in_stack_fffffffffffffdfc,&in_stack_fffffffffffffdf0->d,
                                 (QSemaphore *)in_stack_fffffffffffffde8);
                    }
                    QCoreApplication::postEvent
                              ((QObject *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                               in_stack_fffffffffffffe38,
                               (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
                    local_108 = 0;
                  }
                  else {
                    local_108 = 5;
                  }
                  QMutexLocker<QBasicMutex>::~QMutexLocker
                            ((QMutexLocker<QBasicMutex> *)&in_stack_fffffffffffffdf0->u);
                  if (local_108 == 0) {
                    QSemaphore::acquire((QSemaphore *)in_stack_fffffffffffffde8,0);
                  }
                  QSemaphore::~QSemaphore((QSemaphore *)&local_80.u);
                }
              }
              else if ((-1 < *(int *)&local_e0->field_0x54) ||
                      (bVar3 = QObjectPrivate::removeConnection(in_stack_fffffffffffffe48), bVar3))
              {
                local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_50._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                in_stack_fffffffffffffe38 = in_RDI;
                in_stack_fffffffffffffe44 = in_ESI;
                if (bVar14) {
                  in_stack_fffffffffffffe30 = pCVar8;
                  in_stack_fffffffffffffe48 = pCVar8;
                  QObjectPrivate::get((QObject *)0x4013fb);
                  in_stack_fffffffffffffe28 =
                       QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                                 ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x401407);
                }
                else {
                  in_stack_fffffffffffffe30 = (Connection *)0x0;
                  in_stack_fffffffffffffe28 = (ConnectionData *)0x0;
                  in_stack_fffffffffffffe48 = in_stack_fffffffffffffe30;
                }
                QObjectPrivate::Sender::Sender
                          ((Sender *)local_50,(QObject *)in_stack_fffffffffffffe30,
                           (QObject *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe44,
                           in_stack_fffffffffffffe28);
                if ((*(uint *)&local_e0->field_0x54 >> 0x1d & 1) == 0) {
                  if ((local_e0->field_6).callFunction != (StaticMetaCallFunction)0x0) {
                    uVar1 = local_e0->method_offset;
                    iVar4 = (*(code *)(((pCVar8->super_ConnectionOrSignalVector).field_0.next)->
                                      super_ConnectionOrSignalVector).field_0)();
                    in_stack_fffffffffffffe20 = (void **)CONCAT44(extraout_var,iVar4);
                    iVar4 = QMetaObject::methodOffset((QMetaObject *)&in_stack_fffffffffffffdf0->u);
                    if ((int)(uint)uVar1 <= iVar4) {
                      in_stack_fffffffffffffec4 = 0;
                      (*(local_e0->field_6).callFunction)
                                ((QObject *)pCVar8,InvokeMetaMethod,(uint)local_e0->method_relative,
                                 (void **)local_a0);
                      goto LAB_004015ed;
                    }
                  }
                  in_stack_fffffffffffffec0 =
                       (uint)local_e0->method_relative + (uint)local_e0->method_offset;
                  QMetaObject::metacall
                            ((QObject *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                             (Call)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                             (int)in_stack_fffffffffffffdf0,(void **)in_stack_fffffffffffffde8);
                }
                else {
                  SlotObjectGuard::SlotObjectGuard
                            ((SlotObjectGuard *)&in_stack_fffffffffffffdf0->u,
                             (QSlotObjectBase *)in_stack_fffffffffffffde8);
                  SlotObjectGuard::operator->((SlotObjectGuard *)0x40148e);
                  QtPrivate::QSlotObjectBase::call
                            ((QSlotObjectBase *)&in_stack_fffffffffffffdf0->u,
                             (QObject *)in_stack_fffffffffffffde8,(void **)0x4014a6);
                  SlotObjectGuard::~SlotObjectGuard((SlotObjectGuard *)0x4014b5);
                }
LAB_004015ed:
                QObjectPrivate::Sender::~Sender((Sender *)&in_stack_fffffffffffffdf0->u);
              }
            }
            local_e0 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                 ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x40160b);
            in_stack_fffffffffffffe17 = false;
            if (local_e0 != (Type)0x0) {
              in_stack_fffffffffffffe17 = local_e0->id <= uVar5;
            }
          } while ((bool)in_stack_fffffffffffffe17 != false);
        }
        pQVar6 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
        in_stack_fffffffffffffe16 = local_c8 != pQVar6;
        if (!(bool)in_stack_fffffffffffffe16) goto code_r0x004016a7;
        pQVar6 = (QObjectPrivate *)QObjectPrivate::SignalVector::at(this,-1);
        in_stack_fffffffffffffe08 = local_c8;
        local_c8 = pQVar6;
      } while( true );
    }
  }
LAB_00401725:
  if ((__base_type)*(__pointer_type *)(in_FS_OFFSET + 0x28) == local_8._M_b._M_p) {
    return;
  }
  __stack_chk_fail();
code_r0x004016a7:
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::operator->
            ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)0x4016b4);
  uVar5 = QBasicAtomicInteger<unsigned_int>::loadRelaxed
                    ((QBasicAtomicInteger<unsigned_int> *)0x4016bc);
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> *)
             &in_stack_fffffffffffffdf0->u);
  lockPolicy = (LockPolicy)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  if (uVar5 != 0) {
    QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
              ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x401702);
    QObjectPrivate::ConnectionData::cleanOrphanedConnections
              ((ConnectionData *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (QObject *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),lockPolicy);
  }
  goto LAB_00401725;
}

Assistant:

void doActivate(QObject *sender, int signal_index, void **argv)
{
    QObjectPrivate *sp = QObjectPrivate::get(sender);

    if (sp->blockSig)
        return;

    Q_TRACE_SCOPE(QMetaObject_activate, sender, signal_index);

    if (sp->isDeclarativeSignalConnected(signal_index)
            && QAbstractDeclarativeData::signalEmitted) {
        Q_TRACE_SCOPE(QMetaObject_activate_declarative_signal, sender, signal_index);
        QAbstractDeclarativeData::signalEmitted(sp->declarativeData, sender,
                                                signal_index, argv);
    }

    const QSignalSpyCallbackSet *signal_spy_set = callbacks_enabled ? qt_signal_spy_callback_set.loadAcquire() : nullptr;

    void *empty_argv[] = { nullptr };
    if (!argv)
        argv = empty_argv;

    if (!sp->maybeSignalConnected(signal_index)) {
        // The possible declarative connection is done, and nothing else is connected
        if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
            signal_spy_set->signal_begin_callback(sender, signal_index, argv);
        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
        return;
    }

    if (callbacks_enabled && signal_spy_set->signal_begin_callback != nullptr)
        signal_spy_set->signal_begin_callback(sender, signal_index, argv);

    bool senderDeleted = false;
    {
    Q_ASSERT(sp->connections.loadRelaxed());
    QObjectPrivate::ConnectionDataPointer connections(sp->connections.loadAcquire());
    QObjectPrivate::SignalVector *signalVector = connections->signalVector.loadRelaxed();

    const QObjectPrivate::ConnectionList *list;
    if (signal_index < signalVector->count())
        list = &signalVector->at(signal_index);
    else
        list = &signalVector->at(-1);

    Qt::HANDLE currentThreadId = QThread::currentThreadId();
    bool inSenderThread = currentThreadId == QObjectPrivate::get(sender)->threadData.loadRelaxed()->threadId.loadRelaxed();

    // We need to check against the highest connection id to ensure that signals added
    // during the signal emission are not emitted in this emission.
    uint highestConnectionId = connections->currentConnectionId.loadRelaxed();
    do {
        QObjectPrivate::Connection *c = list->first.loadRelaxed();
        if (!c)
            continue;

        do {
            QObject * const receiver = c->receiver.loadRelaxed();
            if (!receiver)
                continue;

            QThreadData *td = c->receiverThreadData.loadRelaxed();
            if (!td)
                continue;

            bool receiverInSameThread;
            if (inSenderThread) {
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            } else {
                // need to lock before reading the threadId, because moveToThread() could interfere
                QMutexLocker lock(signalSlotLock(receiver));
                receiverInSameThread = currentThreadId == td->threadId.loadRelaxed();
            }


            // determine if this connection should be sent immediately or
            // put into the event queue
            if ((c->connectionType == Qt::AutoConnection && !receiverInSameThread)
                || (c->connectionType == Qt::QueuedConnection)) {
                queued_activate(sender, signal_index, c, argv);
                continue;
#if QT_CONFIG(thread)
            } else if (c->connectionType == Qt::BlockingQueuedConnection) {
                if (receiverInSameThread) {
                    qWarning("Qt: Dead lock detected while activating a BlockingQueuedConnection: "
                    "Sender is %s(%p), receiver is %s(%p)",
                    sender->metaObject()->className(), sender,
                    receiver->metaObject()->className(), receiver);
                }

                if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                    continue;

                QSemaphore semaphore;
                {
                    QMutexLocker locker(signalSlotLock(receiver));
                    if (!c->isSingleShot && !c->receiver.loadAcquire())
                        continue;
                    QMetaCallEvent *ev = c->isSlotObject ?
                        new QMetaCallEvent(c->slotObj, sender, signal_index, argv, &semaphore) :
                        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction,
                                           sender, signal_index, argv, &semaphore);
                    QCoreApplication::postEvent(receiver, ev);
                }
                semaphore.acquire();
                continue;
#endif
            }

            if (c->isSingleShot && !QObjectPrivate::removeConnection(c))
                continue;

            QObjectPrivate::Sender senderData(
                    receiverInSameThread ? receiver : nullptr, sender, signal_index,
                    receiverInSameThread ? QObjectPrivate::get(receiver)->connections.loadAcquire() : nullptr);

            if (c->isSlotObject) {
                SlotObjectGuard obj{c->slotObj};

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot_functor, c->slotObj);
                    obj->call(receiver, argv);
                }
            } else if (c->callFunction && c->method_offset <= receiver->metaObject()->methodOffset()) {
                //we compare the vtable to make sure we are not in the destructor of the object.
                const int method_relative = c->method_relative;
                const auto callFunction = c->callFunction;
                const int methodIndex = (Q_HAS_TRACEPOINTS || callbacks_enabled) ? c->method() : 0;
                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr)
                    signal_spy_set->slot_begin_callback(receiver, methodIndex, argv);

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, methodIndex);
                    callFunction(receiver, QMetaObject::InvokeMetaMethod, method_relative, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, methodIndex);
            } else {
                const int method = c->method_relative + c->method_offset;

                if (callbacks_enabled && signal_spy_set->slot_begin_callback != nullptr) {
                    signal_spy_set->slot_begin_callback(receiver, method, argv);
                }

                {
                    Q_TRACE_SCOPE(QMetaObject_activate_slot, receiver, method);
                    QMetaObject::metacall(receiver, QMetaObject::InvokeMetaMethod, method, argv);
                }

                if (callbacks_enabled && signal_spy_set->slot_end_callback != nullptr)
                    signal_spy_set->slot_end_callback(receiver, method);
            }
        } while ((c = c->nextConnectionList.loadRelaxed()) != nullptr && c->id <= highestConnectionId);

    } while (list != &signalVector->at(-1) &&
        //start over for all signals;
        ((list = &signalVector->at(-1)), true));

        if (connections->currentConnectionId.loadRelaxed() == 0)
            senderDeleted = true;
    }
    if (!senderDeleted) {
        sp->connections.loadAcquire()->cleanOrphanedConnections(sender);

        if (callbacks_enabled && signal_spy_set->signal_end_callback != nullptr)
            signal_spy_set->signal_end_callback(sender, signal_index);
    }
}